

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void __thiscall
density::
heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
::const_iterator::const_iterator
          (const_iterator *this,
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          *i_queue,ControlBlock *i_control)

{
  void *pvVar1;
  
  this->m_control = i_control;
  this->m_queue = i_queue;
  if (i_control != (ControlBlock *)0x0) {
    pvVar1 = heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             ::get_element(i_control);
    (this->m_value).m_pair.m_address = pvVar1;
    (this->m_value).m_pair.m_type.m_feature_table = (tuple_type *)i_control[1].m_next;
  }
  return;
}

Assistant:

const_iterator(const heter_queue * i_queue, ControlBlock * i_control) noexcept
                : m_control(i_control), m_queue(i_queue)
            {
                if (m_control != nullptr)
                {
                    const RUNTIME_TYPE & type = *type_after_control(m_control);
                    new (&m_value.m_pair) value_type(type, get_element(m_control));
                }
            }